

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits_uint16(uint64_t *words,size_t length,uint16_t *out,uint16_t base)

{
  short sVar1;
  ulong uVar2;
  int r;
  uint64_t t;
  uint64_t w;
  size_t i;
  int outpos;
  uint16_t base_local;
  uint16_t *out_local;
  size_t length_local;
  uint64_t *words_local;
  
  i._0_4_ = 0;
  i._6_2_ = base;
  for (w = 0; w < length; w = w + 1) {
    for (t = words[w]; t != 0; t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
      sVar1 = 0;
      for (uVar2 = t; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        sVar1 = sVar1 + 1;
      }
      out[(int)i] = sVar1 + i._6_2_;
      i._0_4_ = (int)i + 1;
    }
    i._6_2_ = i._6_2_ + 0x40;
  }
  return (long)(int)i;
}

Assistant:

size_t bitset_extract_setbits_uint16(const uint64_t *words, size_t length,
                                     uint16_t *out, uint16_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = __builtin_ctzll(w);
            out[outpos++] = r + base;
            w ^= t;
        }
        base += 64;
    }
    return outpos;
}